

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O2

Ray * __thiscall
PinholeCamera::sampleray(Ray *__return_storage_ptr__,PinholeCamera *this,vec2f pos,Sampler *param_2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3f vVar4;
  vec3f vVar5;
  float local_58;
  float fStack_54;
  float fStack_44;
  vec3f local_38;
  vec3f local_28;
  
  fVar2 = (this->super_Camera).position.x;
  fVar3 = (this->super_Camera).position.y;
  fVar1 = (this->super_Camera).position.z;
  vVar4 = operator*(1.0 - (pos.x + pos.x),&this->lefthalf);
  local_38.z = vVar4.z;
  local_38._0_8_ = vVar4._0_8_;
  vVar4 = operator+((vec3f *)&(this->super_Camera).field_0x3c,&local_38);
  fStack_44 = pos.y;
  vVar5 = operator*(1.0 - (fStack_44 + fStack_44),&this->uphalf);
  local_58 = vVar4.x;
  fStack_54 = vVar4.y;
  local_28.z = vVar5.z + vVar4.z;
  local_28.y = vVar5.y + fStack_54;
  local_28.x = vVar5.x + local_58;
  vVar4 = normalized(&local_28);
  (__return_storage_ptr__->origin).x = fVar2;
  (__return_storage_ptr__->origin).y = fVar3;
  (__return_storage_ptr__->origin).z = fVar1;
  (__return_storage_ptr__->dir).x = (float)(int)vVar4._0_8_;
  (__return_storage_ptr__->dir).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (__return_storage_ptr__->dir).z = vVar4.z;
  return __return_storage_ptr__;
}

Assistant:

Ray sampleray(vec2f pos, Sampler&) const {
		return Ray(position, normalized(dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf));
	}